

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

void __thiscall
TPZSFMatrix<long_double>::TPZSFMatrix(TPZSFMatrix<long_double> *this,void **vtt,int64_t dim)

{
  _func_int **pp_Var1;
  int iVar2;
  uint extraout_var;
  longdouble *plVar3;
  
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = dim;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = dim;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  pp_Var1 = (_func_int **)*vtt;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       pp_Var1;
  iVar2 = (*pp_Var1[0x4b])();
  plVar3 = (longdouble *)
           operator_new__(-(ulong)(extraout_var >> 0x1c != 0) | CONCAT44(extraout_var,iVar2) << 4);
  this->fElem = plVar3;
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (this);
  return;
}

Assistant:

TPZSFMatrix<TVar> ::TPZSFMatrix(const int64_t dim )
: TPZRegisterClassId(&TPZSFMatrix::ClassId),
TPZMatrix<TVar>( dim, dim )
{
    int64_t size = Size();
	fElem = new TVar[ size ] ;
	
	if ( fElem == NULL )
		TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Constructor <memory allocation error>." );
	
	// Zera a Matriz.
	Zero();
}